

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

int __thiscall
CVmObjDate::getp_getClockTime(CVmObjDate *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  ulong uVar1;
  int32_t in_EAX;
  int iVar2;
  CVmTimeZone *tz;
  uint argc;
  undefined4 in_register_00000034;
  int32_t daytime;
  int32_t dayno;
  
  if (oargc == (uint *)0x0) {
    argc = 0;
  }
  else {
    argc = *oargc;
  }
  daytime = in_EAX;
  if (getp_getClockTime(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar2 = __cxa_guard_acquire(&getp_getClockTime(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                CONCAT44(in_register_00000034,self));
    if (iVar2 != 0) {
      getp_getClockTime::desc.min_argc_ = 0;
      getp_getClockTime::desc.opt_argc_ = 1;
      getp_getClockTime::desc.varargs_ = 0;
      __cxa_guard_release(&getp_getClockTime(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getClockTime::desc);
  if (iVar2 == 0) {
    tz = get_tz_arg(0,argc);
    get_local_time(this,&dayno,&daytime,tz);
    uVar1 = (long)daytime / 1000;
    make_int_list(retval,4,(long)daytime / 3600000 & 0xffffffff,
                  (long)((ulong)(uint)((int)((long)daytime / 60000) >> 0x1f) << 0x20 |
                        (long)daytime / 60000 & 0xffffffffU) % 0x3c & 0xffffffff,
                  (long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % 0x3c &
                  0xffffffff,(long)daytime % 1000 & 0xffffffff);
    sp_ = sp_ + -(long)(int)argc;
  }
  return 1;
}

Assistant:

int CVmObjDate::getp_getClockTime(
    VMG_ vm_obj_id_t self, vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get my date and time in local time */
    int32_t dayno, daytime;
    get_local_time(dayno, daytime, get_tz_arg(vmg_ 0, argc));

    /* return [hour, minute, second, msec] */
    make_int_list(vmg_ retval, 4,
                  daytime/(60*60*1000),
                  daytime/(60*1000) % 60,
                  daytime/(1000) % 60,
                  daytime % 1000);

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}